

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_checkpoint.cpp
# Opt level: O0

void ConcurrentCheckpoint::CheckpointThread<false>(DuckDB *db,bool *read_correct)

{
  initializer_list<duckdb::Value> iVar1;
  initializer_list<duckdb::Value> iVar2;
  bool bVar3;
  byte bVar4;
  undefined1 *in_RSI;
  DuckDB *in_RDI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result_2;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result_1;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  Connection con;
  allocator_type *in_stack_fffffffffffffd68;
  vector<duckdb::Value,_true> *in_stack_fffffffffffffd70;
  iterator in_stack_fffffffffffffd78;
  size_type in_stack_fffffffffffffd80;
  Value *local_258;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined1 *in_stack_fffffffffffffdb8;
  allocator *in_stack_fffffffffffffdc0;
  Value *local_1e0;
  undefined1 local_1b9;
  Value *local_1b8;
  Value local_1b0 [64];
  Value *local_170;
  undefined8 local_168;
  allocator local_141;
  string local_140 [32];
  string local_120 [8];
  int local_118;
  allocator local_111;
  string local_110 [32];
  string local_f0 [16];
  Value *local_e0;
  Value local_d8 [64];
  Value *local_98;
  undefined8 local_90;
  allocator local_59;
  string local_58 [32];
  string local_38 [8];
  Connection local_30 [32];
  undefined1 *local_10;
  
  local_10 = in_RSI;
  duckdb::Connection::Connection(local_30,in_RDI);
  while (bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd78),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"SELECT SUM(money) FROM accounts",&local_59);
    duckdb::Connection::Query(local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_e0 = local_d8;
    duckdb::Value::Value(local_e0,100);
    local_98 = local_d8;
    local_90 = 1;
    std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x789e3c);
    iVar1._M_len = in_stack_fffffffffffffd80;
    iVar1._M_array = in_stack_fffffffffffffd78;
    duckdb::vector<duckdb::Value,_true>::vector
              (in_stack_fffffffffffffd70,iVar1,in_stack_fffffffffffffd68);
    bVar3 = duckdb::CHECK_COLUMN
                      ((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                        *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                       (vector<duckdb::Value,_true> *)
                       CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    duckdb::vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x789ea2);
    std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x789eaf);
    local_1e0 = (Value *)&local_98;
    do {
      local_1e0 = local_1e0 + -0x40;
      duckdb::Value::~Value(local_1e0);
    } while (local_1e0 != local_d8);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      *local_10 = 0;
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x78a078);
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"CHECKPOINT",&local_111);
      duckdb::Connection::Query(local_f0);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      duckdb::
      unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
      ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                    *)in_stack_fffffffffffffd70);
      bVar4 = duckdb::BaseQueryResult::HasError();
      if ((bVar4 & 1) == 0) {
        local_118 = 5;
      }
      else {
        local_118 = 0;
      }
      duckdb::
      unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
      ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                     *)0x78a1bb);
    } while (local_118 == 0);
    in_stack_fffffffffffffdc0 = &local_141;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_140,"SELECT SUM(money) FROM accounts",in_stack_fffffffffffffdc0);
    duckdb::Connection::Query(local_120);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    local_1b8 = local_1b0;
    duckdb::Value::Value(local_1b8,100);
    local_170 = local_1b0;
    local_168 = 1;
    in_stack_fffffffffffffdb8 = &local_1b9;
    std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x78a27f);
    iVar2._M_len = in_stack_fffffffffffffd80;
    iVar2._M_array = in_stack_fffffffffffffd78;
    duckdb::vector<duckdb::Value,_true>::vector
              (in_stack_fffffffffffffd70,iVar2,in_stack_fffffffffffffd68);
    in_stack_fffffffffffffdb7 =
         duckdb::CHECK_COLUMN
                   ((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                     *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                    (vector<duckdb::Value,_true> *)
                    CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    bVar4 = in_stack_fffffffffffffdb7 ^ 0xff;
    duckdb::vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x78a2d9);
    std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x78a2e6);
    local_258 = (Value *)&local_170;
    do {
      local_258 = local_258 + -0x40;
      duckdb::Value::~Value(local_258);
    } while (local_258 != local_1b0);
    if ((bVar4 & 1) != 0) {
      *local_10 = 0;
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x78a474);
  }
  duckdb::Connection::~Connection(local_30);
  return;
}

Assistant:

static void CheckpointThread(DuckDB *db, bool *read_correct) {
		Connection con(*db);
		while (!finished) {
			{
				// the total balance should remain constant regardless of updates and checkpoints
				auto result = con.Query("SELECT SUM(money) FROM accounts");
				if (!CHECK_COLUMN(result, 0,
				                  {CONCURRENT_UPDATE_TOTAL_ACCOUNTS * CONCURRENT_UPDATE_MONEY_PER_ACCOUNT})) {
					*read_correct = false;
				}
			}
			while (true) {
				auto result = con.Query(FORCE_CHECKPOINT ? "FORCE CHECKPOINT" : "CHECKPOINT");
				if (!result->HasError()) {
					break;
				}
			}
			{
				// the total balance should remain constant regardless of updates and checkpoints
				auto result = con.Query("SELECT SUM(money) FROM accounts");
				if (!CHECK_COLUMN(result, 0,
				                  {CONCURRENT_UPDATE_TOTAL_ACCOUNTS * CONCURRENT_UPDATE_MONEY_PER_ACCOUNT})) {
					*read_correct = false;
				}
			}
		}
	}